

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<char_const(&)[2],kj::String&,char_const(&)[18]>
          (String *__return_storage_ptr__,kj *this,char (*params) [2],String *params_1,
          char (*params_2) [18])

{
  char *pcVar1;
  kj *local_50;
  size_t local_48;
  ArrayPtr<const_char> local_40;
  ArrayPtr<const_char> local_30;
  
  local_48 = strlen((char *)this);
  pcVar1 = *(char **)(params + 4);
  local_30.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_30.ptr = *(char **)params;
  }
  local_30.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_30.size_ = (size_t)(pcVar1 + -1);
  }
  local_50 = this;
  local_40.size_ = strlen((char *)params_1);
  local_40.ptr = (char *)params_1;
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_50,&local_30,&local_40,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}